

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameRunner.cpp
# Opt level: O0

void runGame(void)

{
  int iVar1;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [55];
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  Game aGame;
  
  Game::Game((Game *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Chet",&local_b1);
  Game::add((Game *)local_90,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Pat",&local_e9);
  Game::add((Game *)local_90,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"Sue",&local_111);
  Game::add((Game *)local_90,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  do {
    iVar1 = rand();
    Game::roll((Game *)local_90,iVar1 + 1 + (iVar1 / 5) * -5);
    iVar1 = rand();
    if (iVar1 % 9 == 7) {
      notAWinner = Game::wrongAnswer((Game *)local_90);
    }
    else {
      notAWinner = Game::wasCorrectlyAnswered((Game *)local_90);
    }
  } while (notAWinner != false);
  Game::~Game((Game *)local_90);
  return;
}

Assistant:

void runGame() {
  Game aGame;

  aGame.add("Chet");
  aGame.add("Pat");
  aGame.add("Sue");

  do {

    aGame.roll(rand() % 5 + 1);

    if (rand() % 9 == 7) {
      notAWinner = aGame.wrongAnswer();
    } else {
      notAWinner = aGame.wasCorrectlyAnswered();
    }
  } while (notAWinner);
}